

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm1d.c
# Opt level: O1

void av1_fdct16(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined7 in_register_00000011;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int32_t step [16];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  int iStack_50;
  undefined8 uStack_4c;
  int iStack_44;
  undefined8 uStack_40;
  
  av1_range_check_buf(0,input,input,0x10,*stage_range);
  *output = input[0xf] + *input;
  output[1] = input[0xe] + input[1];
  output[2] = input[0xd] + input[2];
  output[3] = input[0xc] + input[3];
  output[4] = input[0xb] + input[4];
  output[5] = input[10] + input[5];
  output[6] = input[9] + input[6];
  output[7] = input[8] + input[7];
  output[8] = input[7] - input[8];
  output[9] = input[6] - input[9];
  output[10] = input[5] - input[10];
  output[0xb] = input[4] - input[0xb];
  output[0xc] = input[3] - input[0xc];
  output[0xd] = input[2] - input[0xd];
  output[0xe] = input[1] - input[0xe];
  output[0xf] = *input - input[0xf];
  av1_range_check_buf(1,input,output,0x10,stage_range[1]);
  lVar4 = (long)(int)CONCAT71(in_register_00000011,cos_bit);
  lVar5 = lVar4 * 0x100;
  local_78._0_4_ = output[7] + *output;
  local_78._4_4_ = output[6] + output[1];
  uStack_70._0_4_ = output[5] + output[2];
  uStack_70._4_4_ = output[4] + output[3];
  uStack_68._0_4_ = output[3] - output[4];
  uStack_68._4_4_ = output[2] - output[5];
  uStack_60._0_4_ = output[1] - output[6];
  uStack_60._4_4_ = *output - output[7];
  local_58 = *(undefined8 *)(output + 8);
  iVar1 = *(int *)(&DAT_004e0da0 + lVar5);
  lVar9 = (long)iVar1;
  iVar11 = -iVar1;
  lVar10 = 1L << (cos_bit - 1U & 0x3f);
  lVar6 = output[0xd] * lVar9 + lVar10;
  iStack_50 = (int)(output[10] * iVar11 + lVar6 >> (cos_bit & 0x3fU));
  lVar8 = output[0xc] * lVar9 + lVar10;
  uStack_4c._0_4_ = (int)(output[0xb] * iVar11 + lVar8 >> (cos_bit & 0x3fU));
  uStack_4c._4_4_ = (int32_t)(output[0xb] * iVar1 + lVar8 >> (cos_bit & 0x3fU));
  iStack_44 = (int)(output[10] * iVar1 + lVar6 >> (cos_bit & 0x3fU));
  uStack_40 = *(undefined8 *)(output + 0xe);
  av1_range_check_buf(2,input,(int32_t *)&local_78,0x10,stage_range[2]);
  *output = uStack_70._4_4_ + (int)local_78;
  output[1] = (int)uStack_70 + local_78._4_4_;
  output[2] = local_78._4_4_ - (int)uStack_70;
  output[3] = (int)local_78 - uStack_70._4_4_;
  output[4] = (int)uStack_68;
  lVar6 = (int)uStack_60 * lVar9 + lVar10;
  output[5] = (int32_t)(uStack_68._4_4_ * iVar11 + lVar6 >> (cos_bit & 0x3fU));
  output[6] = (int32_t)(uStack_68._4_4_ * iVar1 + lVar6 >> (cos_bit & 0x3fU));
  output[7] = uStack_60._4_4_;
  output[8] = (int)uStack_4c + (int32_t)local_58;
  output[9] = iStack_50 + local_58._4_4_;
  output[10] = local_58._4_4_ - iStack_50;
  output[0xb] = (int32_t)local_58 - (int)uStack_4c;
  output[0xc] = uStack_40._4_4_ - uStack_4c._4_4_;
  output[0xd] = (int)uStack_40 - iStack_44;
  output[0xe] = (int)uStack_40 + iStack_44;
  output[0xf] = uStack_40._4_4_ + uStack_4c._4_4_;
  av1_range_check_buf(3,input,output,0x10,stage_range[3]);
  lVar6 = *output * lVar9 + lVar10;
  local_78 = CONCAT44((int)(iVar11 * output[1] + lVar6 >> (cos_bit & 0x3fU)),
                      (int)(output[1] * iVar1 + lVar6 >> (cos_bit & 0x3fU)));
  iVar1 = *(int *)(&DAT_004e0de0 + lVar5);
  iVar11 = *(int *)(&DAT_004e0d60 + lVar4 * 0x20);
  iVar7 = -iVar11;
  uStack_70 = CONCAT44((int)(output[3] * iVar1 + lVar10 + (long)(output[2] * iVar7) >>
                            (cos_bit & 0x3fU)),
                       (int)(output[2] * iVar1 + lVar10 + (long)(output[3] * iVar11) >>
                            (cos_bit & 0x3fU)));
  uStack_68._0_4_ = output[5] + output[4];
  uStack_60._4_4_ = output[6] + output[7];
  uStack_68._4_4_ = output[4] - output[5];
  uStack_60._0_4_ = output[7] - output[6];
  local_58._0_4_ = output[8];
  local_58._4_4_ =
       (int32_t)(output[0xe] * iVar1 + lVar10 + (long)(output[9] * iVar7) >> (cos_bit & 0x3fU));
  iStack_50 = (int)(-(iVar1 * output[10]) + lVar10 + (long)(output[0xd] * iVar7) >>
                   (cos_bit & 0x3fU));
  uStack_4c = *(undefined8 *)(output + 0xb);
  iStack_44 = (int)(output[0xd] * iVar1 + lVar10 + (long)(iVar7 * output[10]) >> (cos_bit & 0x3fU));
  uStack_40._0_4_ =
       (int)(output[9] * iVar1 + lVar10 + (long)(output[0xe] * iVar11) >> (cos_bit & 0x3fU));
  uStack_40._4_4_ = output[0xf];
  av1_range_check_buf(4,input,(int32_t *)&local_78,0x10,stage_range[4]);
  *(undefined8 *)output = local_78;
  *(undefined8 *)(output + 2) = uStack_70;
  iVar1 = *(int *)(&DAT_004e0e00 + lVar5);
  iVar11 = *(int *)(&DAT_004e0d40 + lVar4 * 0x20);
  iVar7 = LoadMaskz2[lVar4 * 8 + 7][4];
  output[4] = (int32_t)((int)uStack_68 * iVar1 + lVar10 + (long)(uStack_60._4_4_ * iVar11) >>
                       (cos_bit & 0x3fU));
  iVar2 = *(int *)(&DAT_004e0d80 + lVar5);
  iVar3 = *(int *)(&DAT_004e0dc0 + lVar5);
  output[5] = (int32_t)(uStack_68._4_4_ * iVar2 + lVar10 + (long)((int)uStack_60 * iVar3) >>
                       (cos_bit & 0x3fU));
  output[6] = (int32_t)((int)uStack_60 * iVar2 + lVar10 + (long)-(uStack_68._4_4_ * iVar3) >>
                       (cos_bit & 0x3fU));
  output[7] = (int32_t)(uStack_60._4_4_ * iVar1 + lVar10 + (long)-((int)uStack_68 * iVar11) >>
                       (cos_bit & 0x3fU));
  output[8] = local_58._4_4_ + (int32_t)local_58;
  output[9] = (int32_t)local_58 - local_58._4_4_;
  output[10] = (int)uStack_4c - iStack_50;
  output[0xb] = iStack_50 + (int)uStack_4c;
  output[0xc] = iStack_44 + uStack_4c._4_4_;
  output[0xd] = uStack_4c._4_4_ - iStack_44;
  output[0xe] = uStack_40._4_4_ - (int)uStack_40;
  output[0xf] = (int)uStack_40 + uStack_40._4_4_;
  av1_range_check_buf(5,input,output,0x10,stage_range[5]);
  local_78 = *(undefined8 *)output;
  uStack_70 = *(undefined8 *)(output + 2);
  uStack_68 = *(undefined8 *)(output + 4);
  uStack_60 = *(undefined8 *)(output + 6);
  local_58._0_4_ =
       (int32_t)(output[8] * *(int *)(&DAT_004e0e10 + lVar5) + lVar10 + (long)(output[0xf] * iVar7)
                >> (cos_bit & 0x3fU));
  local_58._4_4_ =
       (int32_t)(output[9] * *(int *)(&DAT_004e0d90 + lVar5) + lVar10 +
                 (long)(output[0xe] * *(int *)(&DAT_004e0db0 + lVar5)) >> (cos_bit & 0x3fU));
  iStack_50 = (int)(output[10] * *(int *)(&DAT_004e0dd0 + lVar5) + lVar10 +
                    (long)(output[0xd] * *(int *)(&DAT_004e0d70 + lVar4 * 0x20)) >>
                   (cos_bit & 0x3fU));
  uStack_4c._0_4_ =
       (int)(output[0xb] * *(int *)(&DAT_004e0d50 + lVar4 * 0x20) + lVar10 +
             (long)(output[0xc] * *(int *)(&DAT_004e0df0 + lVar5)) >> (cos_bit & 0x3fU));
  uStack_4c._4_4_ =
       (int32_t)(output[0xc] * *(int *)(&DAT_004e0d50 + lVar4 * 0x20) + lVar10 +
                 (long)-(output[0xb] * *(int *)(&DAT_004e0df0 + lVar5)) >> (cos_bit & 0x3fU));
  iStack_44 = (int)(output[0xd] * *(int *)(&DAT_004e0dd0 + lVar5) + lVar10 +
                    (long)-(output[10] * *(int *)(&DAT_004e0d70 + lVar4 * 0x20)) >>
                   (cos_bit & 0x3fU));
  uStack_40._0_4_ =
       (int)(output[0xe] * *(int *)(&DAT_004e0d90 + lVar5) + lVar10 +
             (long)-(output[9] * *(int *)(&DAT_004e0db0 + lVar5)) >> (cos_bit & 0x3fU));
  uStack_40._4_4_ =
       (int32_t)(output[0xf] * *(int *)(&DAT_004e0e10 + lVar5) + lVar10 + (long)-(output[8] * iVar7)
                >> (cos_bit & 0x3fU));
  av1_range_check_buf(6,input,(int32_t *)&local_78,0x10,stage_range[6]);
  *output = (int)local_78;
  output[1] = (int32_t)local_58;
  output[2] = (int)uStack_68;
  output[3] = uStack_4c._4_4_;
  output[4] = (int)uStack_70;
  output[5] = iStack_50;
  output[6] = (int)uStack_60;
  output[7] = (int)uStack_40;
  output[8] = local_78._4_4_;
  output[9] = local_58._4_4_;
  output[10] = uStack_68._4_4_;
  output[0xb] = iStack_44;
  output[0xc] = uStack_70._4_4_;
  output[0xd] = (int)uStack_4c;
  output[0xe] = uStack_60._4_4_;
  output[0xf] = uStack_40._4_4_;
  av1_range_check_buf(7,input,output,0x10,stage_range[7]);
  return;
}

Assistant:

void av1_fdct16(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  const int32_t size = 16;
  const int32_t *cospi;

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[16];

  // stage 0;
  av1_range_check_buf(stage, input, input, size, stage_range[stage]);

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0] + input[15];
  bf1[1] = input[1] + input[14];
  bf1[2] = input[2] + input[13];
  bf1[3] = input[3] + input[12];
  bf1[4] = input[4] + input[11];
  bf1[5] = input[5] + input[10];
  bf1[6] = input[6] + input[9];
  bf1[7] = input[7] + input[8];
  bf1[8] = -input[8] + input[7];
  bf1[9] = -input[9] + input[6];
  bf1[10] = -input[10] + input[5];
  bf1[11] = -input[11] + input[4];
  bf1[12] = -input[12] + input[3];
  bf1[13] = -input[13] + input[2];
  bf1[14] = -input[14] + input[1];
  bf1[15] = -input[15] + input[0];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0] + bf0[7];
  bf1[1] = bf0[1] + bf0[6];
  bf1[2] = bf0[2] + bf0[5];
  bf1[3] = bf0[3] + bf0[4];
  bf1[4] = -bf0[4] + bf0[3];
  bf1[5] = -bf0[5] + bf0[2];
  bf1[6] = -bf0[6] + bf0[1];
  bf1[7] = -bf0[7] + bf0[0];
  bf1[8] = bf0[8];
  bf1[9] = bf0[9];
  bf1[10] = half_btf(-cospi[32], bf0[10], cospi[32], bf0[13], cos_bit);
  bf1[11] = half_btf(-cospi[32], bf0[11], cospi[32], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[32], bf0[12], cospi[32], bf0[11], cos_bit);
  bf1[13] = half_btf(cospi[32], bf0[13], cospi[32], bf0[10], cos_bit);
  bf1[14] = bf0[14];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0] + bf0[3];
  bf1[1] = bf0[1] + bf0[2];
  bf1[2] = -bf0[2] + bf0[1];
  bf1[3] = -bf0[3] + bf0[0];
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[5], cos_bit);
  bf1[7] = bf0[7];
  bf1[8] = bf0[8] + bf0[11];
  bf1[9] = bf0[9] + bf0[10];
  bf1[10] = -bf0[10] + bf0[9];
  bf1[11] = -bf0[11] + bf0[8];
  bf1[12] = -bf0[12] + bf0[15];
  bf1[13] = -bf0[13] + bf0[14];
  bf1[14] = bf0[14] + bf0[13];
  bf1[15] = bf0[15] + bf0[12];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(-cospi[32], bf0[1], cospi[32], bf0[0], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[48], bf0[3], -cospi[16], bf0[2], cos_bit);
  bf1[4] = bf0[4] + bf0[5];
  bf1[5] = -bf0[5] + bf0[4];
  bf1[6] = -bf0[6] + bf0[7];
  bf1[7] = bf0[7] + bf0[6];
  bf1[8] = bf0[8];
  bf1[9] = half_btf(-cospi[16], bf0[9], cospi[48], bf0[14], cos_bit);
  bf1[10] = half_btf(-cospi[48], bf0[10], -cospi[16], bf0[13], cos_bit);
  bf1[11] = bf0[11];
  bf1[12] = bf0[12];
  bf1[13] = half_btf(cospi[48], bf0[13], -cospi[16], bf0[10], cos_bit);
  bf1[14] = half_btf(cospi[16], bf0[14], cospi[48], bf0[9], cos_bit);
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[24], bf0[6], -cospi[40], bf0[5], cos_bit);
  bf1[7] = half_btf(cospi[56], bf0[7], -cospi[8], bf0[4], cos_bit);
  bf1[8] = bf0[8] + bf0[9];
  bf1[9] = -bf0[9] + bf0[8];
  bf1[10] = -bf0[10] + bf0[11];
  bf1[11] = bf0[11] + bf0[10];
  bf1[12] = bf0[12] + bf0[13];
  bf1[13] = -bf0[13] + bf0[12];
  bf1[14] = -bf0[14] + bf0[15];
  bf1[15] = bf0[15] + bf0[14];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  cospi = cospi_arr(cos_bit);
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = bf0[6];
  bf1[7] = bf0[7];
  bf1[8] = half_btf(cospi[60], bf0[8], cospi[4], bf0[15], cos_bit);
  bf1[9] = half_btf(cospi[28], bf0[9], cospi[36], bf0[14], cos_bit);
  bf1[10] = half_btf(cospi[44], bf0[10], cospi[20], bf0[13], cos_bit);
  bf1[11] = half_btf(cospi[12], bf0[11], cospi[52], bf0[12], cos_bit);
  bf1[12] = half_btf(cospi[12], bf0[12], -cospi[52], bf0[11], cos_bit);
  bf1[13] = half_btf(cospi[44], bf0[13], -cospi[20], bf0[10], cos_bit);
  bf1[14] = half_btf(cospi[28], bf0[14], -cospi[36], bf0[9], cos_bit);
  bf1[15] = half_btf(cospi[60], bf0[15], -cospi[4], bf0[8], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = bf0[8];
  bf1[2] = bf0[4];
  bf1[3] = bf0[12];
  bf1[4] = bf0[2];
  bf1[5] = bf0[10];
  bf1[6] = bf0[6];
  bf1[7] = bf0[14];
  bf1[8] = bf0[1];
  bf1[9] = bf0[9];
  bf1[10] = bf0[5];
  bf1[11] = bf0[13];
  bf1[12] = bf0[3];
  bf1[13] = bf0[11];
  bf1[14] = bf0[7];
  bf1[15] = bf0[15];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);
}